

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

void __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::GetListValues
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this,idx_t row_idx,TYPE *start_value,
          TYPE *end_value,INCREMENT_TYPE *increment_value)

{
  TYPE TVar1;
  ulong uVar2;
  idx_t iVar3;
  INCREMENT_TYPE IVar4;
  
  TVar1 = StartListValue(this,row_idx);
  start_value->value = (int64_t)TVar1;
  uVar2 = (ulong)(*(long *)(this->args + 8) - *(long *)this->args != 0x68);
  iVar3 = row_idx;
  if (**(long **)(&this->field_0x8 + uVar2 * 0x48) != 0) {
    iVar3 = (idx_t)*(uint *)(**(long **)(&this->field_0x8 + uVar2 * 0x48) + row_idx * 4);
  }
  end_value->value = *(int64_t *)(*(long *)(&this->field_0x10 + uVar2 * 0x48) + iVar3 * 8);
  IVar4 = ListIncrementValue(this,row_idx);
  *increment_value = IVar4;
  return;
}

Assistant:

void GetListValues(idx_t row_idx, typename OP::TYPE &start_value, typename OP::TYPE &end_value,
	                   typename OP::INCREMENT_TYPE &increment_value) {
		start_value = StartListValue(row_idx);
		end_value = EndListValue(row_idx);
		increment_value = ListIncrementValue(row_idx);
	}